

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

RealisticCamera *
pbrt::RealisticCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,FilmHandle *film,
          MediumHandle *medium,FileLoc *loc,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_03;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  Point2i p_02;
  span<const_pbrt::Point2<float>_> vert_00;
  span<const_pbrt::Point2<float>_> vert_01;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  float *pfVar5;
  Tuple2<pbrt::Point2,_float> *pTVar6;
  Point2i PVar7;
  Image *in_R9;
  Float FVar8;
  float fVar9;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar11;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int x_4;
  int y_4;
  Float scale;
  Float avg_1;
  int x_3;
  int y_3;
  Float sum;
  Float avg;
  int x_2;
  int y_2;
  Image mono;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata im;
  Float r;
  int i_1;
  array<pbrt::Point2<float>,_10> vert_1;
  int i;
  Point2f vert [5];
  Float s2;
  Float s1;
  Float c2;
  Float c1;
  int x_1;
  int y_1;
  Float v;
  Float sigma2;
  Float r2;
  Point2f uv;
  int x;
  int y;
  Image apertureImage;
  string apertureName;
  anon_class_16_2_5a488c63 rasterize;
  int builtinRes;
  vector<float,_std::allocator<float>_> lensParameters;
  Float focusDistance;
  Float apertureDiameter;
  string lensFile;
  CameraBaseParameters cameraBaseParameters;
  Image *in_stack_ffffffffffffea58;
  ImageAndMetadata *in_stack_ffffffffffffea60;
  undefined4 in_stack_ffffffffffffea68;
  WrapMode in_stack_ffffffffffffea6c;
  Float in_stack_ffffffffffffea70;
  int in_stack_ffffffffffffea74;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffea78;
  undefined4 in_stack_ffffffffffffea80;
  int in_stack_ffffffffffffea84;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffea88;
  undefined4 in_stack_ffffffffffffea90;
  int in_stack_ffffffffffffea94;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffea98;
  undefined4 in_stack_ffffffffffffeaa0;
  float in_stack_ffffffffffffeaa4;
  string *in_stack_ffffffffffffeaa8;
  Float in_stack_ffffffffffffeab0;
  int in_stack_ffffffffffffeab4;
  ParameterDictionary *in_stack_ffffffffffffeab8;
  Float in_stack_ffffffffffffead0;
  int in_stack_ffffffffffffead4;
  Image *in_stack_ffffffffffffead8;
  int in_stack_ffffffffffffeae0;
  WrapMode in_stack_ffffffffffffeae4;
  WrapMode in_stack_ffffffffffffeae8;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffeaec;
  string *in_stack_ffffffffffffeaf8;
  undefined4 in_stack_ffffffffffffeb00;
  undefined4 in_stack_ffffffffffffeb04;
  int iVar17;
  MediumHandle *in_stack_ffffffffffffeb08;
  undefined4 in_stack_ffffffffffffeb10;
  undefined4 in_stack_ffffffffffffeb14;
  CameraTransform *in_stack_ffffffffffffeb18;
  CameraBaseParameters *in_stack_ffffffffffffeb20;
  string *in_stack_ffffffffffffeb28;
  string *psVar18;
  string *local_14d0;
  Image *in_stack_ffffffffffffeb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb40;
  size_t in_stack_ffffffffffffeb48;
  ColorEncodingHandle *in_stack_ffffffffffffeb70;
  PixelFormat in_stack_ffffffffffffeb7c;
  PixelFormat format;
  Image *in_stack_ffffffffffffeb80;
  Image *this;
  Allocator in_stack_ffffffffffffeb88;
  Allocator AVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb90;
  Image *pIVar20;
  size_t in_stack_ffffffffffffeb98;
  undefined1 *puVar21;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffeba0;
  Tuple2<pbrt::Point2,_int> resolution;
  ImageChannelDesc *desc;
  Image *this_00;
  array<pbrt::WrapMode,_2> wrapMode_01;
  int in_stack_ffffffffffffebc8;
  float local_13f4;
  undefined4 in_stack_ffffffffffffec58;
  undefined4 in_stack_ffffffffffffec5c;
  undefined8 in_stack_ffffffffffffec60;
  undefined4 in_stack_ffffffffffffec68;
  undefined4 in_stack_ffffffffffffec6c;
  string *local_1378;
  string *local_12c8;
  int local_11fc;
  int local_11f4;
  int iStack_11ec;
  int local_11e8;
  int local_11d8;
  int local_11bc;
  int local_11b4;
  int iStack_11ac;
  int local_11a8;
  float local_11a4;
  int local_1150;
  int local_1148;
  int iStack_1140;
  int local_113c;
  allocator<char> local_1121;
  string *local_1120;
  string local_1118 [32];
  string *local_10f8;
  undefined8 local_10f0;
  Tuple2<pbrt::Point2,_int> local_10d8;
  Image local_10d0;
  undefined1 local_fb4;
  allocator<char> local_fb3;
  undefined1 local_fb2 [2];
  Image *local_fb0;
  undefined1 local_fa8 [184];
  polymorphic_allocator<unsigned_char> local_ef0;
  Tuple2<pbrt::Point2,_float> local_ba8;
  float local_ba0;
  uint local_b9c;
  array<pbrt::Point2<float>,_10> local_b98;
  ColorEncodingHandle *in_stack_fffffffffffff4f8;
  string *in_stack_fffffffffffff500;
  Allocator in_stack_fffffffffffff508;
  int local_a1c;
  Tuple2<pbrt::Point2,float> local_a18 [48];
  float local_9e8;
  float local_9e4;
  float local_9e0;
  float local_9dc;
  Tuple2<pbrt::Point2,_int> local_9d0;
  int local_9c8;
  Tuple2<pbrt::Point2,_int> local_9c4;
  int local_9bc;
  Image *local_9b8;
  undefined1 local_9a2;
  allocator<char> local_9a1;
  string *local_9a0;
  string local_998 [32];
  string *local_978;
  undefined8 local_970;
  float local_82c;
  float local_828;
  float local_824;
  float local_820;
  float local_81c;
  Tuple2<pbrt::Point2,_int> local_818;
  Tuple2<pbrt::Point2,_int> local_810;
  float local_808;
  float local_804;
  Tuple2<pbrt::Point2,_int> local_800;
  int local_7f8;
  Tuple2<pbrt::Point2,_int> local_7f4;
  int local_7ec;
  Image *local_7e8;
  undefined1 local_7d2;
  allocator<char> local_7d1;
  string *local_7d0;
  string local_7c8 [32];
  string *local_7a8;
  undefined8 local_7a0;
  Image local_660;
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  undefined4 *local_4b8;
  Image **local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  vector<float,_std::allocator<float>_> local_4a0;
  undefined4 local_488;
  allocator<char> local_481;
  string local_480 [32];
  Float local_460;
  allocator<char> local_459;
  string local_458 [32];
  Float local_438;
  allocator<char> local_431;
  string local_430 [55];
  allocator<char> local_3f9;
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [936];
  Image *local_10;
  RealisticCamera *local_8;
  
  local_10 = in_R9;
  FilmHandle::FilmHandle
            ((FilmHandle *)in_stack_ffffffffffffea60,(FilmHandle *)in_stack_ffffffffffffea58);
  MediumHandle::MediumHandle
            ((MediumHandle *)in_stack_ffffffffffffea60,(MediumHandle *)in_stack_ffffffffffffea58);
  CameraBaseParameters::CameraBaseParameters
            (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,
             (FilmHandle *)CONCAT44(in_stack_ffffffffffffeb14,in_stack_ffffffffffffeb10),
             in_stack_ffffffffffffeb08,
             (ParameterDictionary *)CONCAT44(in_stack_ffffffffffffeb04,in_stack_ffffffffffffeb00),
             (FileLoc *)in_stack_ffffffffffffeaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
             (char *)in_stack_ffffffffffffea98,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
             (char *)in_stack_ffffffffffffea98,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
  ParameterDictionary::GetOneString
            (in_stack_ffffffffffffeab8,
             (string *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
             in_stack_ffffffffffffeaa8);
  ResolveFilename(in_stack_ffffffffffffeaf8);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
             (char *)in_stack_ffffffffffffea98,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
  FVar8 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_ffffffffffffea60,
                     (string *)in_stack_ffffffffffffea58,0.0);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  local_438 = FVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
             (char *)in_stack_ffffffffffffea98,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
  FVar8 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_ffffffffffffea60,
                     (string *)in_stack_ffffffffffffea58,0.0);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  local_460 = FVar8;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ReadFloatFile(in_stack_ffffffffffffeb28);
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70));
    if (bVar1) {
      Error<std::__cxx11::string&>
                ((FileLoc *)CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                 (char *)in_stack_ffffffffffffea98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
      local_8 = (RealisticCamera *)0x0;
      local_488 = 1;
    }
    else {
      sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_4a0);
      if ((sVar4 & 3) == 0) {
        local_4a8 = 0x100;
        local_4b8 = &local_4a8;
        local_4b0 = &local_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                   (char *)in_stack_ffffffffffffea98,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                   (char *)in_stack_ffffffffffffea98,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90))
        ;
        ParameterDictionary::GetOneString
                  (in_stack_ffffffffffffeab8,
                   (string *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                   in_stack_ffffffffffffeaa8);
        ResolveFilename(in_stack_ffffffffffffeaf8);
        std::__cxx11::string::~string(local_4f8);
        std::__cxx11::string::~string(local_540);
        std::allocator<char>::~allocator(&local_541);
        std::__cxx11::string::~string(local_518);
        std::allocator<char>::~allocator(&local_519);
        pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                  ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffea60);
        AVar19.memoryResource._4_4_ = in_stack_ffffffffffffeae4;
        AVar19.memoryResource._0_4_ = in_stack_ffffffffffffeae0;
        Image::Image(in_stack_ffffffffffffead8,AVar19);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58);
          if (bVar1) {
            Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                (int)in_stack_ffffffffffffea58);
            local_7d2 = 1;
            local_7d0 = local_7c8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                       (char *)in_stack_ffffffffffffea98,
                       (allocator<char> *)
                       CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
            local_7d2 = 0;
            local_7a8 = local_7c8;
            local_7a0 = 1;
            v_00._M_array._4_4_ = in_stack_ffffffffffffea6c;
            v_00._M_array._0_4_ = in_stack_ffffffffffffea68;
            v_00._M_len._0_4_ = in_stack_ffffffffffffea70;
            v_00._M_len._4_4_ = in_stack_ffffffffffffea74;
            pstd::
            span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffea60,v_00);
            ColorEncodingHandle::TaggedPointer
                      ((ColorEncodingHandle *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
            local_7e8 = local_10;
            channels.n = in_stack_ffffffffffffeb98;
            channels.ptr = in_stack_ffffffffffffeb90;
            Image::Image(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb7c,
                         (Point2i)in_stack_ffffffffffffeba0,channels,in_stack_ffffffffffffeb70,
                         in_stack_ffffffffffffeb88);
            Image::operator=(&in_stack_ffffffffffffea60->image,local_10);
            Image::~Image(&in_stack_ffffffffffffea60->image);
            local_12c8 = (string *)&local_7a8;
            in_stack_ffffffffffffea58 = local_10;
            do {
              local_12c8 = local_12c8 + -0x20;
              std::__cxx11::string::~string(local_12c8);
            } while (local_12c8 != local_7c8);
            std::allocator<char>::~allocator(&local_7d1);
            local_7ec = 0;
            while( true ) {
              iVar2 = local_7ec;
              local_7f4 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
              if (local_7f4.y <= iVar2) break;
              local_7f8 = 0;
              while( true ) {
                iVar2 = local_7f8;
                local_800 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
                if (local_800.x <= iVar2) break;
                local_810 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
                local_818 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffea60,
                           (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                           SUB84(in_stack_ffffffffffffea58,0));
                fVar9 = Sqr<float>(local_808);
                local_81c = Sqr<float>(local_804);
                local_81c = fVar9 + local_81c;
                local_820 = 1.0;
                local_828 = 0.0;
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar12._0_4_ = SUB164(ZEXT416((uint)local_81c) ^ auVar16,0) / 1.0;
                auVar12._4_12_ = SUB1612(ZEXT416((uint)local_81c) ^ auVar16,4);
                dVar10 = std::exp(auVar12._0_8_);
                auVar13._0_4_ = -1.0 / local_820;
                auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
                dVar11 = std::exp(auVar13._0_8_);
                local_82c = SUB84(dVar10,0) - SUB84(dVar11,0);
                pfVar5 = std::max<float>(&local_828,&local_82c);
                local_824 = *pfVar5;
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                    (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                    (int)in_stack_ffffffffffffea58);
                PVar7.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffeae4;
                PVar7.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffeae0;
                Image::SetChannel(in_stack_ffffffffffffead8,PVar7,in_stack_ffffffffffffead4,
                                  in_stack_ffffffffffffead0);
                local_7f8 = local_7f8 + 1;
              }
              local_7ec = local_7ec + 1;
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58);
            if (bVar1) {
              Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                  (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                  (int)in_stack_ffffffffffffea58);
              local_9a2 = 1;
              local_9a0 = local_998;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                         (char *)in_stack_ffffffffffffea98,
                         (allocator<char> *)
                         CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
              local_9a2 = 0;
              local_978 = local_998;
              local_970 = 1;
              v_01._M_array._4_4_ = in_stack_ffffffffffffea6c;
              v_01._M_array._0_4_ = in_stack_ffffffffffffea68;
              v_01._M_len._0_4_ = in_stack_ffffffffffffea70;
              v_01._M_len._4_4_ = in_stack_ffffffffffffea74;
              pstd::
              span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffea60,v_01);
              ColorEncodingHandle::TaggedPointer
                        ((ColorEncodingHandle *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58)
              ;
              local_9b8 = local_10;
              channels_00.n = in_stack_ffffffffffffeb98;
              channels_00.ptr = in_stack_ffffffffffffeb90;
              Image::Image(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb7c,
                           (Point2i)in_stack_ffffffffffffeba0,channels_00,in_stack_ffffffffffffeb70,
                           in_stack_ffffffffffffeb88);
              Image::operator=(&in_stack_ffffffffffffea60->image,local_10);
              Image::~Image(&in_stack_ffffffffffffea60->image);
              local_1378 = (string *)&local_978;
              in_stack_ffffffffffffea58 = local_10;
              do {
                local_1378 = local_1378 + -0x20;
                std::__cxx11::string::~string(local_1378);
              } while (local_1378 != local_998);
              std::allocator<char>::~allocator(&local_9a1);
              local_9bc = 0;
              while( true ) {
                iVar2 = local_9bc;
                local_9c4 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
                if (local_9c4.y <= iVar2) break;
                local_9c8 = 0;
                while( true ) {
                  iVar2 = local_9c8;
                  local_9d0 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
                  if (local_9d0.x <= iVar2) break;
                  Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                      (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                      (int)in_stack_ffffffffffffea58);
                  p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffeae4;
                  p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffeae0;
                  Image::SetChannel(in_stack_ffffffffffffead8,p,in_stack_ffffffffffffead4,
                                    in_stack_ffffffffffffead0);
                  local_9c8 = local_9c8 + 1;
                }
                local_9bc = local_9bc + 1;
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58
                                     );
              if (bVar1) {
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                local_9dc = (SUB84(dVar10,0) + -1.0) * 0.25;
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                local_9e0 = (SUB84(dVar10,0) + 1.0) * 0.25;
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416(SUB84(dVar10,0)),
                                          SUB6416(ZEXT464(0x41200000),0));
                dVar10 = std::sqrt(auVar12._0_8_);
                local_9e4 = SUB84(dVar10,0) * 0.25;
                dVar10 = std::sqrt(SUB648(ZEXT464(0x40a00000),0));
                auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416(SUB84(dVar10,0)),
                                          SUB6416(ZEXT464(0x41200000),0));
                dVar10 = std::sqrt(auVar12._0_8_);
                local_9e8 = SUB84(dVar10,0) * 0.25;
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffea60,
                           (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                           SUB84(in_stack_ffffffffffffea58,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffea60,
                           (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                           SUB84(in_stack_ffffffffffffea58,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffea60,
                           (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                           SUB84(in_stack_ffffffffffffea58,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffea60,
                           (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                           SUB84(in_stack_ffffffffffffea58,0));
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_ffffffffffffea60,
                           (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                           SUB84(in_stack_ffffffffffffea58,0));
                for (local_a1c = 0; local_a1c < 5; local_a1c = local_a1c + 1) {
                  Tuple2<pbrt::Point2,float>::operator*=(local_a18 + (long)local_a1c * 8,0.8);
                }
                pstd::span<pbrt::Point2<float>const>::span<5ul>
                          ((span<const_pbrt::Point2<float>_> *)in_stack_ffffffffffffea60,
                           (Point2<float> (*) [5])in_stack_ffffffffffffea58);
                vert_00.n._0_4_ = in_stack_ffffffffffffec68;
                vert_00.ptr = (Point2<float> *)in_stack_ffffffffffffec60;
                vert_00.n._4_4_ = in_stack_ffffffffffffec6c;
                Create::anon_class_16_2_5a488c63::operator()
                          ((anon_class_16_2_5a488c63 *)
                           CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),vert_00);
                Image::operator=(&in_stack_ffffffffffffea60->image,in_stack_ffffffffffffea58);
                Image::~Image(&in_stack_ffffffffffffea60->image);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffea60,
                                        (char *)in_stack_ffffffffffffea58);
                if (bVar1) {
                  pstd::array<pbrt::Point2<float>,_10>::array
                            ((array<pbrt::Point2<float>,_10> *)
                             CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70));
                  for (local_b9c = 0; (int)local_b9c < 10; local_b9c = local_b9c + 1) {
                    if ((local_b9c & 1) == 0) {
                      FVar8 = Radians(72.0);
                      dVar10 = std::cos((double)(ulong)(uint)FVar8);
                      FVar8 = Radians(36.0);
                      dVar11 = std::cos((double)(ulong)(uint)FVar8);
                      local_13f4 = SUB84(dVar10,0) / SUB84(dVar11,0);
                    }
                    else {
                      local_13f4 = 1.0;
                    }
                    local_ba0 = local_13f4;
                    auVar14._0_4_ = ((float)(int)local_b9c * 3.1415927) / 5.0;
                    auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    std::cos(auVar14._0_8_);
                    auVar15._0_4_ = ((float)(int)local_b9c * 3.1415927) / 5.0;
                    auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    std::sin(auVar15._0_8_);
                    Point2<float>::Point2
                              ((Point2<float> *)in_stack_ffffffffffffea60,
                               (float)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                               SUB84(in_stack_ffffffffffffea58,0));
                    pTVar6 = &pstd::array<pbrt::Point2<float>,_10>::operator[]
                                        (&local_b98,(long)(int)local_b9c)->
                              super_Tuple2<pbrt::Point2,_float>;
                    *pTVar6 = local_ba8;
                  }
                  pstd::array<pbrt::Point2<float>,_10>::begin(&local_b98);
                  pstd::array<pbrt::Point2<float>,_10>::end(&local_b98);
                  std::reverse<pbrt::Point2<float>*>
                            ((Point2<float> *)
                             CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
                             (Point2<float> *)
                             CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68));
                  pstd::span<pbrt::Point2<float>const>::
                  span<pstd::array<pbrt::Point2<float>,10>,void,pstd::array<pbrt::Point2<float>,10>>
                            ((span<const_pbrt::Point2<float>_> *)
                             CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
                             (array<pbrt::Point2<float>,_10> *)
                             CONCAT44(in_stack_ffffffffffffea6c,in_stack_ffffffffffffea68));
                  vert_01.n._0_4_ = in_stack_ffffffffffffec68;
                  vert_01.ptr = (Point2<float> *)in_stack_ffffffffffffec60;
                  vert_01.n._4_4_ = in_stack_ffffffffffffec6c;
                  Create::anon_class_16_2_5a488c63::operator()
                            ((anon_class_16_2_5a488c63 *)
                             CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),vert_01);
                  Image::operator=(&in_stack_ffffffffffffea60->image,in_stack_ffffffffffffea58);
                  Image::~Image(&in_stack_ffffffffffffea60->image);
                }
                else {
                  local_ef0.memoryResource = (memory_resource *)local_10;
                  ColorEncodingHandle::TaggedPointer
                            ((ColorEncodingHandle *)in_stack_ffffffffffffea60,
                             in_stack_ffffffffffffea58);
                  Image::Read(in_stack_fffffffffffff500,in_stack_fffffffffffff508,
                              in_stack_fffffffffffff4f8);
                  Image::operator=(&in_stack_ffffffffffffea60->image,in_stack_ffffffffffffea58);
                  iVar2 = Image::NChannels((Image *)0x69002d);
                  if (1 < iVar2) {
                    local_fb4 = 1;
                    this_00 = (Image *)local_fa8;
                    wrapMode_01.values = (WrapMode  [2])((long)local_fb2 + 1);
                    local_fb0 = this_00;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                               (char *)in_stack_ffffffffffffea98,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
                    local_fb0 = (Image *)(local_fa8 + 0x20);
                    desc = (ImageChannelDesc *)local_fb2;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                               (char *)in_stack_ffffffffffffea98,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
                    puVar21 = local_fa8 + 0x40;
                    resolution = (Tuple2<pbrt::Point2,_int>)&local_fb3;
                    local_fb0 = (Image *)puVar21;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                               (char *)in_stack_ffffffffffffea98,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
                    local_fb4 = 0;
                    local_fa8._96_8_ = local_fa8;
                    local_fa8._104_8_ = 3;
                    v_02._M_array._4_4_ = in_stack_ffffffffffffea6c;
                    v_02._M_array._0_4_ = in_stack_ffffffffffffea68;
                    v_02._M_len._0_4_ = in_stack_ffffffffffffea70;
                    v_02._M_len._4_4_ = in_stack_ffffffffffffea74;
                    pstd::
                    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffea60,v_02);
                    requestedChannels.n = in_stack_ffffffffffffeb48;
                    requestedChannels.ptr = in_stack_ffffffffffffeb40;
                    Image::GetChannelDesc(in_stack_ffffffffffffeb38,requestedChannels);
                    AVar19.memoryResource = (memory_resource *)local_fa8;
                    this = (Image *)(local_fa8 + 0x60);
                    do {
                      this = (Image *)&this[-1].p32;
                      std::__cxx11::string::~string((string *)this);
                    } while (this != (Image *)AVar19.memoryResource);
                    pIVar20 = this;
                    std::allocator<char>::~allocator(&local_fb3);
                    std::allocator<char>::~allocator((allocator<char> *)local_fb2);
                    std::allocator<char>::~allocator((allocator<char> *)(local_fb2 + 1));
                    bVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x69021f);
                    format = CONCAT13(bVar1,(int3)in_stack_ffffffffffffeb7c);
                    if (!bVar1) {
                      ErrorExit<std::__cxx11::string&>
                                ((char *)CONCAT44(in_stack_ffffffffffffea94,
                                                  in_stack_ffffffffffffea90),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffea88);
                    }
                    local_10d8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
                    local_1120 = local_1118;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                               (char *)in_stack_ffffffffffffea98,
                               (allocator<char> *)
                               CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90));
                    local_10f8 = local_1118;
                    local_10f0 = 1;
                    v_03._M_array._4_4_ = in_stack_ffffffffffffea6c;
                    v_03._M_array._0_4_ = in_stack_ffffffffffffea68;
                    v_03._M_len._0_4_ = in_stack_ffffffffffffea70;
                    v_03._M_len._4_4_ = in_stack_ffffffffffffea74;
                    pstd::
                    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffea60,v_03);
                    ColorEncodingHandle::TaggedPointer
                              ((ColorEncodingHandle *)in_stack_ffffffffffffea60,
                               in_stack_ffffffffffffea58);
                    channels_01.n = (size_t)puVar21;
                    channels_01.ptr =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pIVar20;
                    Image::Image(this,format,(Point2i)resolution,channels_01,
                                 in_stack_ffffffffffffeb70,AVar19);
                    psVar18 = local_1118;
                    local_14d0 = (string *)&local_10f8;
                    in_stack_ffffffffffffea58 = local_10;
                    do {
                      local_14d0 = local_14d0 + -0x20;
                      std::__cxx11::string::~string(local_14d0);
                    } while (local_14d0 != psVar18);
                    std::allocator<char>::~allocator(&local_1121);
                    local_113c = 0;
                    while( true ) {
                      iVar17 = local_113c;
                      PVar7 = Image::Resolution(&local_10d0);
                      iStack_1140 = PVar7.super_Tuple2<pbrt::Point2,_int>.y;
                      if (iStack_1140 <= iVar17) break;
                      local_1148 = 0;
                      while( true ) {
                        iVar17 = local_1148;
                        PVar7 = Image::Resolution(&local_10d0);
                        local_1150 = PVar7.super_Tuple2<pbrt::Point2,_int>.x;
                        if (local_1150 <= iVar17) break;
                        Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                            (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                            (int)in_stack_ffffffffffffea58);
                        WrapMode2D::WrapMode2D
                                  ((WrapMode2D *)
                                   CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
                                   in_stack_ffffffffffffea6c);
                        p_02.super_Tuple2<pbrt::Point2,_int>.y = iVar2;
                        p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffebc8;
                        Image::GetChannels(this_00,p_02,desc,(WrapMode2D)wrapMode_01.values);
                        ImageChannelValues::Average
                                  ((ImageChannelValues *)
                                   CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70));
                        ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x69066c);
                        Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                            (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                            (int)in_stack_ffffffffffffea58);
                        p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffeae4;
                        p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffeae0;
                        Image::SetChannel(in_stack_ffffffffffffead8,p_00,in_stack_ffffffffffffead4,
                                          in_stack_ffffffffffffead0);
                        local_1148 = local_1148 + 1;
                      }
                      local_113c = local_113c + 1;
                    }
                    Image::operator=(&in_stack_ffffffffffffea60->image,in_stack_ffffffffffffea58);
                    Image::~Image(&in_stack_ffffffffffffea60->image);
                    ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x690848);
                  }
                  ImageAndMetadata::~ImageAndMetadata(in_stack_ffffffffffffea60);
                }
              }
            }
          }
          bVar1 = Image::operator_cast_to_bool(&local_660);
          iVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffead4);
          if (bVar1) {
            local_11a4 = 0.0;
            local_11a8 = 0;
            while( true ) {
              PVar7 = Image::Resolution(&local_660);
              iStack_11ac = PVar7.super_Tuple2<pbrt::Point2,_int>.y;
              if (iStack_11ac <= local_11a8) break;
              local_11b4 = 0;
              while( true ) {
                in_stack_ffffffffffffeab4 = local_11b4;
                PVar7 = Image::Resolution(&local_660);
                local_11bc = PVar7.super_Tuple2<pbrt::Point2,_int>.x;
                if (local_11bc <= in_stack_ffffffffffffeab4) break;
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                    (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                    (int)in_stack_ffffffffffffea58);
                WrapMode2D::WrapMode2D
                          ((WrapMode2D *)
                           CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
                           in_stack_ffffffffffffea6c);
                wrapMode.wrap.values[1] = in_stack_ffffffffffffeae8;
                wrapMode.wrap.values[0] = in_stack_ffffffffffffeae4;
                in_stack_ffffffffffffeab0 =
                     Image::GetChannel(in_stack_ffffffffffffead8,(Point2i)in_stack_ffffffffffffeaec,
                                       iVar2,wrapMode);
                local_11a4 = in_stack_ffffffffffffeab0 + local_11a4;
                local_11b4 = local_11b4 + 1;
              }
              local_11a8 = local_11a8 + 1;
            }
            PVar7 = Image::Resolution(&local_660);
            local_11d8 = PVar7.super_Tuple2<pbrt::Point2,_int>.x;
            in_stack_ffffffffffffea98 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
            local_11e8 = 0;
            while( true ) {
              in_stack_ffffffffffffea84 = local_11e8;
              in_stack_ffffffffffffea88 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660);
              iStack_11ec = in_stack_ffffffffffffea88.y;
              in_stack_ffffffffffffea94 = local_11d8;
              in_stack_ffffffffffffeaa4 = local_11a4;
              if (iStack_11ec <= in_stack_ffffffffffffea84) break;
              local_11f4 = 0;
              while( true ) {
                in_stack_ffffffffffffea74 = local_11f4;
                in_stack_ffffffffffffea78 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(&local_660)
                ;
                local_11fc = in_stack_ffffffffffffea78.x;
                if (local_11fc <= in_stack_ffffffffffffea74) break;
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                    (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                    (int)in_stack_ffffffffffffea58);
                Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffea60,
                                    (int)((ulong)in_stack_ffffffffffffea58 >> 0x20),
                                    (int)in_stack_ffffffffffffea58);
                WrapMode2D::WrapMode2D
                          ((WrapMode2D *)
                           CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
                           in_stack_ffffffffffffea6c);
                wrapMode_00.wrap.values[1] = in_stack_ffffffffffffeae8;
                wrapMode_00.wrap.values[0] = in_stack_ffffffffffffeae4;
                in_stack_ffffffffffffea70 =
                     Image::GetChannel(in_stack_ffffffffffffead8,(Point2i)in_stack_ffffffffffffeaec,
                                       iVar2,wrapMode_00);
                p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffeae4;
                p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffeae0;
                Image::SetChannel(in_stack_ffffffffffffead8,p_01,iVar2,in_stack_ffffffffffffead0);
                local_11f4 = local_11f4 + 1;
              }
              local_11e8 = local_11e8 + 1;
            }
          }
        }
        local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
                            ((polymorphic_allocator<std::byte> *)
                             CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                             (CameraBaseParameters *)in_stack_ffffffffffffea98,
                             (vector<float,_std::allocator<float>_> *)
                             CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                             (float *)in_stack_ffffffffffffea88,
                             (float *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80),
                             (Image *)in_stack_ffffffffffffea78,
                             (polymorphic_allocator<std::byte> *)
                             CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0));
        local_488 = 1;
        Image::~Image(&in_stack_ffffffffffffea60->image);
        std::__cxx11::string::~string(local_4d8);
      }
      else {
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_4a0);
        local_4a4 = (undefined4)sVar4;
        Error<std::__cxx11::string&,int>
                  ((FileLoc *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
                   (char *)in_stack_ffffffffffffeaa8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeaa4,in_stack_ffffffffffffeaa0),
                   (int *)in_stack_ffffffffffffea98);
        local_8 = (RealisticCamera *)0x0;
        local_488 = 1;
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70));
  }
  else {
    Error((FileLoc *)in_stack_ffffffffffffea60,(char *)in_stack_ffffffffffffea58);
    local_8 = (RealisticCamera *)0x0;
    local_488 = 1;
  }
  std::__cxx11::string::~string(local_3b8);
  return local_8;
}

Assistant:

RealisticCamera *RealisticCamera::Create(const ParameterDictionary &parameters,
                                         const CameraTransform &cameraTransform,
                                         FilmHandle film, MediumHandle medium,
                                         const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    // Realistic camera-specific parameters
    std::string lensFile = ResolveFilename(parameters.GetOneString("lensfile", ""));
    Float apertureDiameter = parameters.GetOneFloat("aperturediameter", 1.0);
    Float focusDistance = parameters.GetOneFloat("focusdistance", 10.0);

    if (lensFile.empty()) {
        Error(loc, "No lens description file supplied!");
        return nullptr;
    }
    // Load element data from lens description file
    std::vector<Float> lensParameters = ReadFloatFile(lensFile);
    if (lensParameters.empty()) {
        Error(loc, "Error reading lens specification file \"%s\".", lensFile);
        return nullptr;
    }
    if (lensParameters.size() % 4 != 0) {
        Error(loc,
              "%s: excess values in lens specification file; "
              "must be multiple-of-four values, read %d.",
              lensFile, (int)lensParameters.size());
        return nullptr;
    }

    int builtinRes = 256;
    auto rasterize = [&](pstd::span<const Point2f> vert) {
        Image image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"}, nullptr, alloc);

        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                Point2f p(-1 + 2 * (x + 0.5f) / image.Resolution().x,
                          -1 + 2 * (y + 0.5f) / image.Resolution().y);
                int windingNumber = 0;
                // Test against edges
                for (int i = 0; i < vert.size(); ++i) {
                    int i1 = (i + 1) % vert.size();
                    Float e = (p[0] - vert[i][0]) * (vert[i1][1] - vert[i][1]) -
                              (p[1] - vert[i][1]) * (vert[i1][0] - vert[i][0]);
                    if (vert[i].y <= p.y) {
                        if (vert[i1].y > p.y && e > 0)
                            ++windingNumber;
                    } else if (vert[i1].y <= p.y && e < 0)
                        --windingNumber;
                }

                image.SetChannel({x, y}, 0, windingNumber == 0 ? 0.f : 1.f);
            }

        return image;
    };

    std::string apertureName = ResolveFilename(parameters.GetOneString("aperture", ""));
    Image apertureImage;
    if (!apertureName.empty()) {
        // built-in diaphragm shapes
        if (apertureName == "gaussian") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x) {
                    Point2f uv(-1 + 2 * (x + 0.5f) / apertureImage.Resolution().x,
                               -1 + 2 * (y + 0.5f) / apertureImage.Resolution().y);
                    Float r2 = Sqr(uv.x) + Sqr(uv.y);
                    Float sigma2 = 1;
                    Float v = std::max<Float>(
                        0, std::exp(-r2 / sigma2) - std::exp(-1 / sigma2));
                    apertureImage.SetChannel({x, y}, 0, v);
                }
        } else if (apertureName == "square") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0, 1.f);
        } else if (apertureName == "pentagon") {
            // https://mathworld.wolfram.com/RegularPentagon.html
            Float c1 = (std::sqrt(5.f) - 1) / 4;
            Float c2 = (std::sqrt(5.f) + 1) / 4;
            Float s1 = std::sqrt(10.f + 2.f * std::sqrt(5.f)) / 4;
            Float s2 = std::sqrt(10.f - 2.f * std::sqrt(5.f)) / 4;
            // Vertices in CW order.
            Point2f vert[5] = {Point2f(0, 1), {s1, c1}, {s2, -c2}, {-s2, -c2}, {-s1, c1}};
            // Scale down slightly
            for (int i = 0; i < 5; ++i)
                vert[i] *= .8f;
            apertureImage = rasterize(vert);
        } else if (apertureName == "star") {
            // 5-sided. Vertices are two pentagons--inner and outer radius
            pstd::array<Point2f, 10> vert;
            for (int i = 0; i < 10; ++i) {
                // inner radius: https://math.stackexchange.com/a/2136996
                Float r =
                    (i & 1) ? 1.f : (std::cos(Radians(72.f)) / std::cos(Radians(36.f)));
                vert[i] = Point2f(r * std::cos(Pi * i / 5.f), r * std::sin(Pi * i / 5.f));
            }
            std::reverse(vert.begin(), vert.end());
            apertureImage = rasterize(vert);
        } else {
            ImageAndMetadata im = Image::Read(apertureName, alloc);
            apertureImage = std::move(im.image);
            if (apertureImage.NChannels() > 1) {
                ImageChannelDesc rgbDesc = apertureImage.GetChannelDesc({"R", "G", "B"});
                if (!rgbDesc)
                    ErrorExit("%s: didn't find R, G, B channels to average for "
                              "aperture image.",
                              apertureName);

                Image mono(PixelFormat::Float, apertureImage.Resolution(), {"Y"}, nullptr,
                           alloc);
                for (int y = 0; y < mono.Resolution().y; ++y)
                    for (int x = 0; x < mono.Resolution().x; ++x) {
                        Float avg = apertureImage.GetChannels({x, y}, rgbDesc).Average();
                        mono.SetChannel({x, y}, 0, avg);
                    }

                apertureImage = std::move(mono);
            }
        }

        if (apertureImage) {
            // Normalize it so that brightness matches a circular aperture
            Float sum = 0;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    sum += apertureImage.GetChannel({x, y}, 0);
            Float avg =
                sum / (apertureImage.Resolution().x * apertureImage.Resolution().y);

            Float scale = (Pi / 4) / avg;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0,
                                             apertureImage.GetChannel({x, y}, 0) * scale);
        }
    }

    return alloc.new_object<RealisticCamera>(cameraBaseParameters, lensParameters,
                                             focusDistance, apertureDiameter,
                                             std::move(apertureImage), alloc);
}